

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
avg_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
evaluate(avg_function<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
         *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *args,error_code *ec)

{
  bool bVar1;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar2;
  unsigned_long *puVar3;
  const_reference this_00;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  iterator this_01;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_RSI;
  undefined8 in_RDI;
  array_range_type aVar5;
  value_type vVar6;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  iterator __end0;
  iterator __begin0;
  array_range_type *__range3;
  double sum;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  jsonpath_errc __e;
  error_code *in_stack_ffffffffffffff30;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  __normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_78;
  iterator local_70;
  iterator in_stack_ffffffffffffff98;
  double local_58;
  
  pbVar2 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           std::
           vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::size(in_RDX);
  function_base<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  arity(in_RSI);
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x6230b9);
  if (pbVar2 == (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)*puVar3) {
    this_00 = std::
              vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ::operator[](in_RDX,0);
    parameter<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
              (this_00);
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                      (in_stack_ffffffffffffff38);
    if (bVar1) {
      bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                        (in_stack_ffffffffffffff98._M_current);
      if (bVar1) {
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      else {
        local_58 = 0.0;
        aVar5 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                          (pbVar2);
        this_01 = aVar5.last_._M_current;
        local_70 = aVar5.first_._M_current;
        local_78._M_current =
             (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
             ::begin((range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                      *)&local_70);
        range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
        ::end((range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
               *)&local_70);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)in_stack_ffffffffffffff20,
                             (__normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                              *)in_stack_ffffffffffffff18);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::operator*(&local_78);
          __e = (jsonpath_errc)((ulong)in_stack_ffffffffffffff28 >> 0x20);
          bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                            (this_01._M_current);
          if (!bVar1) {
            std::error_code::operator=(in_stack_ffffffffffffff30,__e);
            basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
            basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            goto LAB_00623358;
          }
          in_stack_ffffffffffffff28 =
               (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as<double>
                         (in_stack_ffffffffffffff20);
          local_58 = (double)in_stack_ffffffffffffff28 + local_58;
          __gnu_cxx::
          __normal_iterator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::operator++(&local_78);
        }
        pbVar2 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                           (in_stack_ffffffffffffff28);
        basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                  (pbVar2,local_58,none);
      }
    }
    else {
      std::error_code::operator=
                (in_stack_ffffffffffffff30,(jsonpath_errc)((ulong)in_stack_ffffffffffffff28 >> 0x20)
                );
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
LAB_00623358:
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x623365);
    uVar4 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=
              (in_stack_ffffffffffffff30,(jsonpath_errc)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    uVar4 = extraout_RDX;
  }
  vVar6.field_0.int64_.val_ = uVar4;
  vVar6.field_0._0_8_ = in_RDI;
  return (value_type)vVar6.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            if (arg0.empty())
            {
                return value_type::null();
            }
            double sum = 0;
            for (auto& j : arg0.array_range())
            {
                if (!j.is_number())
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                sum += j.template as<double>();
            }

            return value_type(sum / static_cast<double>(arg0.size()), semantic_tag::none);
        }